

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QLocalePrivate * findLocalePrivate(Language language,Script script,Territory territory)

{
  qsizetype qVar1;
  Type *this;
  QLocalePrivate *pQVar2;
  Int IVar3;
  QLocaleId lid;
  undefined6 in_register_0000003a;
  QLocaleData *pQVar4;
  
  if ((int)CONCAT62(in_register_0000003a,language) == 1) {
    return (QLocalePrivate *)c_private()::c_locale;
  }
  lid.territory_id = territory;
  lid.script_id = script;
  lid.language_id = language;
  qVar1 = QLocaleData::findLocaleIndex(lid);
  if (locale_data[qVar1].m_language_id == 1) {
    IVar3 = 0;
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>::guard._q_value.
        super___atomic_base<signed_char>._M_i == -1) {
      this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
             ::instance();
      pQVar2 = (this->d).ptr;
      if ((pQVar2 != (QLocalePrivate *)0x0) &&
         ((pQVar2->ref)._q_value.super___atomic_base<int>._M_i != 1)) {
        QSharedDataPointer<QLocalePrivate>::detach_helper(this);
      }
      IVar3 = (((this->d).ptr)->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>
              .super_QFlagsStorage<QLocale::NumberOption>.i;
    }
    if (default_data == (QLocaleData *)0x0) {
      default_data = locale_data;
    }
    pQVar4 = default_data;
    if (default_data == (QLocaleData *)0x0) {
      default_data = locale_data;
    }
    qVar1 = ((long)&default_data[-0x27c3].m_currencySymbol_idx >> 2) * -0x1084210842108421;
  }
  else {
    pQVar4 = locale_data + qVar1;
    IVar3 = 0;
  }
  pQVar2 = (QLocalePrivate *)operator_new(0x20);
  pQVar2->m_data = pQVar4;
  (pQVar2->ref)._q_value.super___atomic_base<int>._M_i = 0;
  pQVar2->m_index = qVar1;
  (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i = IVar3;
  return pQVar2;
}

Assistant:

static QLocalePrivate *findLocalePrivate(QLocale::Language language, QLocale::Script script,
                                         QLocale::Territory territory)
{
    if (language == QLocale::C)
        return c_private();

    qsizetype index = QLocaleData::findLocaleIndex(QLocaleId { language, script, territory });
    Q_ASSERT(index >= 0 && index < locale_data_size);
    const QLocaleData *data = locale_data + index;

    QLocale::NumberOptions numberOptions = QLocale::DefaultNumberOptions;

    // If not found, should use default locale:
    if (data->m_language_id == QLocale::C) {
        if (defaultLocalePrivate.exists())
            numberOptions = defaultLocalePrivate->data()->m_numberOptions;
        data = defaultData();
        index = defaultIndex();
    }
    return new QLocalePrivate(data, index, numberOptions);
}